

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aesgcmsiv.cc
# Opt level: O2

int anon_unknown.dwarf_ac4e9c::aead_aes_gcm_siv_asm_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  aead_aes_gcm_siv_asm_ctx *paVar1;
  uint uVar2;
  size_t i;
  long lVar3;
  int reason;
  int line;
  ulong uVar4;
  undefined8 local_1c8;
  ulong uStack_1c0;
  uint64_t record_auth_key [2];
  undefined1 local_198 [24];
  aead_aes_gcm_siv_asm_ctx *local_180;
  uint8_t *local_178;
  size_t *local_170;
  uint64_t record_enc_key [4];
  long local_148;
  long local_140;
  aead_aes_gcm_siv_asm_ctx enc_key_expanded;
  
  if (in_len < 0x1000000001 && ad_len < 0x2000000000000000) {
    if (max_out_tag_len < 0x10) {
      reason = 0x67;
      line = 0x15b;
    }
    else {
      if (nonce_len == 0xc) {
        uVar2 = (int)ctx + 8U & 8;
        local_180 = (aead_aes_gcm_siv_asm_ctx *)((long)&ctx->state + (ulong)uVar2);
        local_178 = out_tag;
        local_170 = out_tag_len;
        aead_aes_gcm_siv_kdf
                  (*(int *)((long)&ctx->state + (ulong)uVar2 + 0xf0),local_180,record_auth_key,
                   record_enc_key,nonce);
        local_1c8 = 0;
        uStack_1c0 = 0;
        if (0x8f < in_len || 0x8f < ad_len) {
          aesgcmsiv_htable_init(&enc_key_expanded,record_auth_key);
          aesgcmsiv_htable_polyval(&enc_key_expanded,ad,ad_len & 0x1ffffffffffffff0,&local_1c8);
        }
        else {
          aesgcmsiv_polyval_horner(&local_1c8,record_auth_key,ad,ad_len >> 4);
        }
        uVar4 = ad_len & 0xf;
        if (uVar4 != 0) {
          memset(local_198 + uVar4,0,0x10 - uVar4);
          memcpy(local_198,ad + (ad_len & 0x1ffffffffffffff0),uVar4);
          aesgcmsiv_polyval_horner(&local_1c8,record_auth_key,local_198,1);
        }
        if (0x8f < in_len || 0x8f < ad_len) {
          aesgcmsiv_htable_polyval(&enc_key_expanded,in,in_len & 0x1ffffffff0,&local_1c8);
        }
        else {
          aesgcmsiv_polyval_horner(&local_1c8,record_auth_key,in,in_len >> 4);
        }
        uVar4 = in_len & 0xf;
        if (uVar4 != 0) {
          memset(local_198 + uVar4,0,0x10 - uVar4);
          memcpy(local_198,in + (in_len & 0x1ffffffff0),uVar4);
          aesgcmsiv_polyval_horner(&local_1c8,record_auth_key,local_198,1);
        }
        local_148 = ad_len << 3;
        local_140 = in_len * 8;
        aesgcmsiv_polyval_horner(&local_1c8,record_auth_key,&local_148,1);
        paVar1 = local_180;
        for (lVar3 = 0; lVar3 != 0xc; lVar3 = lVar3 + 1) {
          *(byte *)((long)&local_1c8 + lVar3) = *(byte *)((long)&local_1c8 + lVar3) ^ nonce[lVar3];
        }
        uStack_1c0 = uStack_1c0 & 0x7fffffffffffffff;
        if (local_180->is_128_bit == 0) {
          aes256gcmsiv_aes_ks_enc_x1(&local_1c8,&local_1c8,&enc_key_expanded,record_enc_key);
          if (in_len < 0x80) {
            aes256gcmsiv_enc_msg_x4(in,out,&local_1c8,&enc_key_expanded,(uint)in_len & 0x70);
          }
          else {
            aes256gcmsiv_enc_msg_x8(in,out,&local_1c8,&enc_key_expanded,in_len & 0x1ffffffff0);
          }
        }
        else {
          aes128gcmsiv_aes_ks_enc_x1(&local_1c8,&local_1c8,&enc_key_expanded,record_enc_key);
          if (in_len < 0x80) {
            aes128gcmsiv_enc_msg_x4(in,out,&local_1c8,&enc_key_expanded,(uint)in_len & 0x70);
          }
          else {
            aes128gcmsiv_enc_msg_x8(in,out,&local_1c8,&enc_key_expanded,in_len & 0x1ffffffff0);
          }
        }
        if (uVar4 != 0) {
          aead_aes_gcm_siv_asm_crypt_last_block
                    (paVar1->is_128_bit,out,in,in_len,(uint8_t *)&local_1c8,&enc_key_expanded);
        }
        *(undefined8 *)local_178 = local_1c8;
        *(ulong *)(local_178 + 8) = uStack_1c0;
        *local_170 = 0x10;
        return 1;
      }
      reason = 0x79;
      line = 0x160;
    }
  }
  else {
    reason = 0x75;
    line = 0x156;
  }
  ERR_put_error(0x1e,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aesgcmsiv.cc"
                ,line);
  return 0;
}

Assistant:

int aead_aes_gcm_siv_asm_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_aes_gcm_siv_asm_ctx *gcm_siv_ctx = asm_ctx_from_ctx(ctx);
  const uint64_t in_len_64 = in_len;
  const uint64_t ad_len_64 = ad_len;

  if (in_len_64 > (UINT64_C(1) << 36) || ad_len_64 >= (UINT64_C(1) << 61)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  if (max_out_tag_len < EVP_AEAD_AES_GCM_SIV_TAG_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BUFFER_TOO_SMALL);
    return 0;
  }

  if (nonce_len != EVP_AEAD_AES_GCM_SIV_NONCE_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  alignas(16) uint64_t record_auth_key[2];
  alignas(16) uint64_t record_enc_key[4];
  aead_aes_gcm_siv_kdf(gcm_siv_ctx->is_128_bit, gcm_siv_ctx, record_auth_key,
                       record_enc_key, nonce);

  alignas(16) uint8_t tag[16] = {0};
  gcm_siv_asm_polyval(tag, in, in_len, ad, ad_len,
                      (const uint8_t *)record_auth_key, nonce);

  struct aead_aes_gcm_siv_asm_ctx enc_key_expanded;

  if (gcm_siv_ctx->is_128_bit) {
    aes128gcmsiv_aes_ks_enc_x1(tag, tag, &enc_key_expanded.key[0],
                               record_enc_key);

    if (in_len < 128) {
      aes128gcmsiv_enc_msg_x4(in, out, tag, &enc_key_expanded, in_len & ~15);
    } else {
      aes128gcmsiv_enc_msg_x8(in, out, tag, &enc_key_expanded, in_len & ~15);
    }
  } else {
    aes256gcmsiv_aes_ks_enc_x1(tag, tag, &enc_key_expanded.key[0],
                               record_enc_key);

    if (in_len < 128) {
      aes256gcmsiv_enc_msg_x4(in, out, tag, &enc_key_expanded, in_len & ~15);
    } else {
      aes256gcmsiv_enc_msg_x8(in, out, tag, &enc_key_expanded, in_len & ~15);
    }
  }

  if (in_len & 15) {
    aead_aes_gcm_siv_asm_crypt_last_block(gcm_siv_ctx->is_128_bit, out, in,
                                          in_len, tag, &enc_key_expanded);
  }

  OPENSSL_memcpy(out_tag, tag, sizeof(tag));
  *out_tag_len = EVP_AEAD_AES_GCM_SIV_TAG_LEN;

  return 1;
}